

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O3

void vkt::api::anon_unknown_0::addResolveImageWholeCopyBeforeResolvingTests(TestCaseGroup *group)

{
  uint uVar1;
  TestContext *testCtx;
  ResolveImageToImageTestCase *node;
  pointer __src;
  long *plVar2;
  pointer __dest;
  long lVar3;
  string *psVar4;
  VkSampleCountFlagBits sampleFlag;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar5;
  ulong __n;
  VkDeviceSize *pVVar6;
  _anonymous_namespace_ *this;
  value_type *pvVar7;
  CopyRegion imageResolve;
  undefined1 local_168 [32];
  ResolveImageToImageTestCase *local_148;
  pointer local_140;
  _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  *local_138;
  long local_130;
  undefined1 local_128 [80];
  Buffer local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  local_a8;
  Data local_88;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  pointer local_58;
  long local_50;
  long local_48;
  uint local_40;
  
  local_a8.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.size = 0x2500000001;
  uStack_d0 = 0x4000000040;
  local_c8 = 0x600000001;
  uStack_c0 = 0x2500000001;
  local_b8 = 0x4000000040;
  uStack_b0 = 0x700000001;
  pVVar6 = &DAT_00ad9fb8;
  pvVar7 = (value_type *)local_128;
  for (lVar3 = 8; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pvVar7->bufferCopy).srcOffset = *pVVar6;
    pVVar6 = pVVar6 + 1;
    pvVar7 = (value_type *)&(pvVar7->bufferCopy).dstOffset;
  }
  local_128._64_4_ = 1;
  std::
  vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ::push_back(&local_a8,(value_type *)local_128);
  __src = local_a8.
          super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_140 = local_a8.
              super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  __n = (long)local_a8.
              super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_a8.
              super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_138 = (_Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
               *)(((long)__n >> 4) * -0x3333333333333333);
  lVar3 = 0;
  uVar5 = extraout_RDX;
  do {
    uVar1 = *(uint *)((long)&api::(anonymous_namespace)::samples + lVar3);
    local_130 = lVar3;
    api::(anonymous_namespace)::getSampleCountCaseName_abi_cxx11_
              ((string *)local_168,(_anonymous_namespace_ *)(ulong)uVar1,
               (VkSampleCountFlagBits)uVar5);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,0xad8e33);
    psVar4 = (string *)(plVar2 + 2);
    if ((string *)*plVar2 == psVar4) {
      local_128._16_8_ = (psVar4->_M_dataplus)._M_p;
      local_128._24_8_ = plVar2[3];
      local_128._0_8_ = (string *)(local_128 + 0x10);
    }
    else {
      local_128._16_8_ = (psVar4->_M_dataplus)._M_p;
      local_128._0_8_ = (string *)*plVar2;
    }
    local_128._8_8_ = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((string *)local_168._0_8_ != (string *)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    local_148 = (ResolveImageToImageTestCase *)operator_new(200);
    testCtx = (group->super_TestNode).m_testCtx;
    this = (_anonymous_namespace_ *)(ulong)uVar1;
    api::(anonymous_namespace)::getSampleCountCaseName_abi_cxx11_
              ((string *)local_168,this,sampleFlag);
    local_68 = local_b8;
    uStack_60 = uStack_b0;
    local_88._16_8_ = local_c8;
    uStack_70 = uStack_c0;
    local_88.buffer.size = (Buffer)(Buffer)local_d8.size;
    local_88._8_8_ = uStack_d0;
    __dest = std::
             _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
             ::_M_allocate(local_138,(size_t)this);
    lVar3 = (long)__dest + __n;
    local_58 = __dest;
    local_48 = lVar3;
    if (local_140 != __src) {
      memmove(__dest,__src,__n);
    }
    node = local_148;
    local_50 = lVar3;
    local_40 = uVar1;
    ResolveImageToImageTestCase::ResolveImageToImageTestCase
              (local_148,testCtx,(string *)local_168._0_8_,(string *)local_128._0_8_,
               (TestParams *)&local_88.buffer,COPY_MS_IMAGE_TO_MS_IMAGE);
    tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)node);
    uVar5 = extraout_RDX_00;
    if (__dest != (pointer)0x0) {
      operator_delete(__dest,__n);
      uVar5 = extraout_RDX_01;
    }
    if ((string *)local_168._0_8_ != (string *)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
      uVar5 = extraout_RDX_02;
    }
    if ((string *)local_128._0_8_ != (string *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
      uVar5 = extraout_RDX_03;
    }
    lVar3 = local_130 + 4;
  } while (lVar3 != 0x18);
  if (__src != (pointer)0x0) {
    operator_delete(__src,(long)local_a8.
                                super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src);
  }
  return;
}

Assistant:

void addResolveImageWholeCopyBeforeResolvingTests (tcu::TestCaseGroup* group)
{
	TestParams	params;
	params.src.image.imageType			= VK_IMAGE_TYPE_2D;
	params.src.image.format				= VK_FORMAT_R8G8B8A8_UNORM;
	params.src.image.extent				= defaultExtent;
	params.src.image.operationLayout	= VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
	params.dst.image.imageType			= VK_IMAGE_TYPE_2D;
	params.dst.image.format				= VK_FORMAT_R8G8B8A8_UNORM;
	params.dst.image.extent				= defaultExtent;
	params.dst.image.operationLayout	= VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;

	{
		const VkImageSubresourceLayers	sourceLayer	=
		{
			VK_IMAGE_ASPECT_COLOR_BIT,	// VkImageAspectFlags	aspectMask;
			0u,							// uint32_t				mipLevel;
			0u,							// uint32_t				baseArrayLayer;
			1u							// uint32_t				layerCount;
		};

		const VkImageResolve			testResolve	=
		{
			sourceLayer,		// VkImageSubresourceLayers	srcSubresource;
			{0, 0, 0},			// VkOffset3D				srcOffset;
			sourceLayer,		// VkImageSubresourceLayers	dstSubresource;
			{0, 0, 0},			// VkOffset3D				dstOffset;
			defaultExtent,		// VkExtent3D				extent;
		};

		CopyRegion	imageResolve;
		imageResolve.imageResolve	= testResolve;
		params.regions.push_back(imageResolve);
	}

	for (int samplesIndex = 0; samplesIndex < DE_LENGTH_OF_ARRAY(samples); ++samplesIndex)
	{
		params.samples					= samples[samplesIndex];
		const std::string description	= "With " + getSampleCountCaseName(samples[samplesIndex]);
		group->addChild(new ResolveImageToImageTestCase(group->getTestContext(), getSampleCountCaseName(samples[samplesIndex]), description, params, COPY_MS_IMAGE_TO_MS_IMAGE));
	}
}